

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

void pfd_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  PortForwarding *pf_00;
  PortForwarding *pf;
  char *error_msg_local;
  PlugCloseType type_local;
  Plug *plug_local;
  
  pf_00 = (PortForwarding *)(plug + -8);
  if (type == PLUGCLOSE_NORMAL) {
    if (pf_00->c != (SshChannel *)0x0) {
      sshfwd_write_eof(pf_00->c);
    }
  }
  else if (pf_00->c == (SshChannel *)0x0) {
    pfd_close(pf_00);
  }
  else {
    sshfwd_initiate_close(pf_00->c,error_msg);
  }
  return;
}

Assistant:

static void pfd_closing(Plug *plug, PlugCloseType type, const char *error_msg)
{
    struct PortForwarding *pf =
        container_of(plug, struct PortForwarding, plug);

    if (type != PLUGCLOSE_NORMAL) {
        /*
         * Socket error. Slam the connection instantly shut.
         */
        if (pf->c) {
            sshfwd_initiate_close(pf->c, error_msg);
        } else {
            /*
             * We might not have an SSH channel, if a socket error
             * occurred during SOCKS negotiation. If not, we must
             * clean ourself up without sshfwd_initiate_close's call
             * back to pfd_close.
             */
            pfd_close(pf);
        }
    } else {
        /*
         * Ordinary EOF received on socket. Send an EOF on the SSH
         * channel.
         */
        if (pf->c)
            sshfwd_write_eof(pf->c);
    }
}